

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall BoundaryElement::clear_cluster_potentials(BoundaryElement *this)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_01;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_02;
  iterator __first;
  Timer *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa0;
  
  Timer::start(in_RDI);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
  __last._M_current._4_4_ = in_stack_ffffffffffffff9c;
  __last._M_current._0_4_ = in_stack_ffffffffffffff98;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (in_stack_ffffffffffffffa0,__last,(int *)in_RDI);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
  __last_00._M_current._4_4_ = in_stack_ffffffffffffff9c;
  __last_00._M_current._0_4_ = in_stack_ffffffffffffff98;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (in_stack_ffffffffffffffa0,__last_00,(int *)in_RDI);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
  __last_01._M_current._4_4_ = in_stack_ffffffffffffff9c;
  __last_01._M_current._0_4_ = in_stack_ffffffffffffff98;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (in_stack_ffffffffffffffa0,__last_01,(int *)in_RDI);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
  __last_02._M_current._4_4_ = 0;
  __last_02._M_current._0_4_ = in_stack_ffffffffffffff98;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,__last_02,(int *)in_RDI);
  Timer::stop((Timer *)__first._M_current);
  return;
}

Assistant:

void BoundaryElement::clear_cluster_potentials()
{
    timers_.clear_cluster_potentials.start();

#ifdef OPENACC_ENABLED
    std::size_t num_potentials = num_charges_;
    double* __restrict clusters_p_ptr    = interp_potential_.data();
    double* __restrict clusters_p_dx_ptr = interp_potential_dx_.data();
    double* __restrict clusters_p_dy_ptr = interp_potential_dy_.data();
    double* __restrict clusters_p_dz_ptr = interp_potential_dz_.data();
    
    #pragma acc parallel loop present(clusters_p_ptr, clusters_p_dx_ptr, \
                                      clusters_p_dy_ptr, clusters_p_dz_ptr)
    for (std::size_t i = 0; i < num_potentials; ++i) {
        clusters_p_ptr[i] = 0.;
        clusters_p_dx_ptr[i] = 0.;
        clusters_p_dy_ptr[i] = 0.;
        clusters_p_dz_ptr[i] = 0.;
    }
#else
    std::fill(interp_potential_.begin(),    interp_potential_.end(),    0);
    std::fill(interp_potential_dx_.begin(), interp_potential_dx_.end(), 0);
    std::fill(interp_potential_dy_.begin(), interp_potential_dy_.end(), 0);
    std::fill(interp_potential_dz_.begin(), interp_potential_dz_.end(), 0);
#endif

    timers_.clear_cluster_potentials.stop();
}